

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confidence.cc
# Opt level: O0

void predict_or_learn_with_confidence<false,true>
               (confidence *param_1,single_learner *base,example *ec)

{
  example *in_RDX;
  learner<char,_example> *in_RSI;
  float fVar1;
  float sensitivity;
  float threshold;
  undefined4 uVar2;
  float fVar3;
  
  fVar3 = 0.0;
  uVar2 = 0;
  LEARNER::learner<char,_example>::predict(in_RSI,in_RDX,0);
  fVar1 = LEARNER::learner<char,_example>::sensitivity(in_RSI,in_RDX,CONCAT44(fVar3,uVar2));
  in_RDX->confidence = ABS((in_RDX->pred).scalar - fVar3) / fVar1;
  return;
}

Assistant:

void predict_or_learn_with_confidence(confidence& /* c */, single_learner& base, example& ec)
{
  float threshold = 0.f;
  float sensitivity = 0.f;
  if (!is_confidence_after_training)
    sensitivity = base.sensitivity(ec);

  if (is_learn)
    base.learn(ec);
  else
    base.predict(ec);

  if (is_confidence_after_training)
    sensitivity = base.sensitivity(ec);

  ec.confidence = fabsf(ec.pred.scalar - threshold) / sensitivity;
}